

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_load.c
# Opt level: O0

char * reader_string(lua_State *L,void *ud,size_t *size)

{
  StringReaderCtx *ctx;
  size_t *size_local;
  void *ud_local;
  lua_State *L_local;
  
  if (*(long *)((long)ud + 8) == 0) {
    L_local = (lua_State *)0x0;
  }
  else {
    *size = *(size_t *)((long)ud + 8);
    *(undefined8 *)((long)ud + 8) = 0;
    L_local = *ud;
  }
  return (char *)L_local;
}

Assistant:

static const char *reader_string(lua_State *L, void *ud, size_t *size)
{
  StringReaderCtx *ctx = (StringReaderCtx *)ud;
  UNUSED(L);
  if (ctx->size == 0) return NULL;
  *size = ctx->size;
  ctx->size = 0;
  return ctx->str;
}